

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

int fctkern__init(fctkern_t *nk,int argc,char **argv)

{
  char **argv_local;
  int argc_local;
  fctkern_t *nk_local;
  
  if ((argc == 0) && (argv == (char **)0x0)) {
    nk_local._4_4_ = 0;
  }
  else {
    memset(nk,0,0x1f8);
    fct_clp__init(&nk->cl_parser,(fctcl_init_t *)0x0);
    fct_nlist__init2(&nk->logger_list,8);
    nk->lt_usr = (fct_logger_types_t *)0x0;
    nk->lt_sys = FCT_LOGGER_TYPES;
    fct_nlist__init2(&nk->prefix_list,0);
    fct_nlist__init2(&nk->ts_list,0);
    nk->cl_is_parsed = 0;
    nk->cl_argc = argc;
    nk->cl_argv = argv;
    fct_namespace_init(&nk->ns);
    nk_local._4_4_ = 1;
  }
  return nk_local._4_4_;
}

Assistant:

static int
fctkern__init(fctkern_t *nk, int argc, const char *argv[])
{
    if ( argc == 0 && argv == NULL )
    {
        return 0;
    }
    memset(nk, 0, sizeof(fctkern_t));
    fct_clp__init(&(nk->cl_parser), NULL);
    fct_nlist__init(&(nk->logger_list));
    nk->lt_usr = NULL;  /* Supplied via 'install' mechanics. */
    nk->lt_sys = FCT_LOGGER_TYPES;
    fct_nlist__init2(&(nk->prefix_list), 0);
    fct_nlist__init2(&(nk->ts_list), 0);
    nk->cl_is_parsed =0;
    /* Save a copy of the arguments. We do a delay parse of the command
    line arguments in order to allow the client code to optionally configure
    the command line parser.*/
    nk->cl_argc = argc;
    nk->cl_argv = argv;
    fct_namespace_init(&(nk->ns));
    return 1;
}